

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace<ncnn::binary_op_rdiv>(Mat *a,float b,Option *opt)

{
  long *in_RDI;
  float fVar1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int d;
  int h;
  int w;
  binary_op_rdiv op;
  Mat *m;
  int local_134;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined4 local_118;
  long local_110;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_100;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined8 local_f0;
  long local_e8;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  binary_op_rdiv local_c1 [13];
  float local_b4;
  long *local_b0;
  undefined8 *local_a8;
  undefined1 local_9d;
  int local_9c;
  undefined8 *local_90;
  undefined8 *local_80;
  long local_78;
  undefined4 local_6c;
  long local_68;
  long local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined8 *local_18;
  
  local_c8 = *(int *)((long)in_RDI + 0x2c);
  local_cc = (int)in_RDI[6];
  local_d0 = *(int *)((long)in_RDI + 0x34);
  local_d4 = (int)in_RDI[7];
  local_d8 = local_c8 * local_cc * local_d0;
  local_b0 = in_RDI;
  for (local_dc = 0; local_dc < local_d4; local_dc = local_dc + 1) {
    local_90 = &local_130;
    local_4c = *(int *)((long)local_b0 + 0x2c);
    local_50 = (int)local_b0[6];
    local_54 = *(undefined4 *)((long)local_b0 + 0x34);
    local_e8 = *local_b0 + local_b0[8] * (long)local_dc * local_b0[2];
    local_68 = local_b0[2];
    local_6c = (undefined4)local_b0[3];
    local_78 = local_b0[4];
    local_48 = &local_130;
    local_38 = (long)local_4c * (long)local_50 * local_68;
    local_80 = &local_130;
    local_a8 = &local_130;
    local_3c = 0x10;
    local_9c = local_dc;
    local_9d = 1;
    local_130 = 0;
    local_120 = 0;
    local_118 = 0;
    local_108 = 0;
    local_104 = 0;
    local_100 = 0;
    local_fc = 0;
    local_f8 = 0;
    local_f0 = 0;
    local_128 = 0;
    local_60 = local_e8;
    local_18 = local_a8;
    local_110 = local_78;
    for (local_134 = 0; local_134 < local_d8; local_134 = local_134 + 1) {
      fVar1 = binary_op_rdiv::operator()
                        (local_c1,(float *)(local_e8 + (long)local_134 * 4),&local_b4);
      *(float *)(local_e8 + (long)local_134 * 4) = fVar1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace(Mat& a, float b, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        for (int i = 0; i < size; i++)
        {
            ptr[i] = op(ptr[i], b);
        }
    }

    return 0;
}